

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

RegOpnd * __thiscall
Lowerer::LoadObjectArray(Lowerer *this,RegOpnd *baseOpnd,Instr *insertBeforeInstr)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  ObjectType OVar4;
  ValueType valueType;
  DWORD offset;
  undefined4 *puVar5;
  RegOpnd *this_00;
  StackSym *pSVar6;
  IndirOpnd *src;
  undefined1 local_50 [8];
  AutoReuseOpnd autoReuseArrayOpnd;
  
  if (baseOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3baf,"(baseOpnd)","baseOpnd");
    if (!bVar2) goto LAB_005d7d12;
    *puVar5 = 0;
  }
  local_50._0_2_ = (baseOpnd->super_Opnd).m_valueType.field_0.bits;
  bVar2 = ValueType::IsLikelyObject((ValueType *)local_50);
  if (bVar2) {
    autoReuseArrayOpnd._22_2_ = (baseOpnd->super_Opnd).m_valueType.field_0;
    OVar4 = ValueType::GetObjectType((ValueType *)&autoReuseArrayOpnd.field_0x16);
    if (OVar4 != ObjectWithArray) goto LAB_005d7adf;
  }
  else {
LAB_005d7adf:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3bb2,
                       "(baseOpnd->GetValueType().IsLikelyObject() && baseOpnd->GetValueType().GetObjectType() == ObjectType::ObjectWithArray)"
                       ,
                       "baseOpnd->GetValueType().IsLikelyObject() && baseOpnd->GetValueType().GetObjectType() == ObjectType::ObjectWithArray"
                      );
    if (!bVar2) goto LAB_005d7d12;
    *puVar5 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3bb3,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) goto LAB_005d7d12;
    *puVar5 = 0;
  }
  func = insertBeforeInstr->m_func;
  bVar2 = IR::RegOpnd::IsArrayRegOpnd(baseOpnd);
  if (bVar2) {
    bVar2 = IR::RegOpnd::IsArrayRegOpnd(baseOpnd);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
      if (!bVar2) {
LAB_005d7d12:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    this_00 = IR::ArrayRegOpnd::CopyAsRegOpnd((ArrayRegOpnd *)baseOpnd,func);
  }
  else {
    this_00 = (RegOpnd *)IR::Opnd::Copy(&baseOpnd->super_Opnd,func);
    OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) goto LAB_005d7d12;
      *puVar5 = 0;
    }
  }
  pSVar6 = StackSym::New(TyVar,func);
  this_00->m_sym = pSVar6;
  local_50._0_2_ = (this_00->super_Opnd).m_valueType.field_0.bits;
  valueType = ValueType::ToArray((ValueType *)local_50);
  IR::Opnd::SetValueType(&this_00->super_Opnd,valueType);
  local_50 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_50,&this_00->super_Opnd,func,false);
  offset = Js::DynamicObject::GetOffsetOfObjectArray();
  src = IR::IndirOpnd::New(baseOpnd,offset,(this_00->super_Opnd).m_type,func,false);
  InsertMove(&this_00->super_Opnd,&src->super_Opnd,insertBeforeInstr,true);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_50);
  return this_00;
}

Assistant:

IR::RegOpnd *Lowerer::LoadObjectArray(IR::RegOpnd *const baseOpnd, IR::Instr *const insertBeforeInstr)
{
    Assert(baseOpnd);
    Assert(
        baseOpnd->GetValueType().IsLikelyObject() &&
        baseOpnd->GetValueType().GetObjectType() == ObjectType::ObjectWithArray);
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;

    // mov  array, [base + offsetOf(objectArrayOrFlags)]
    IR::RegOpnd *const arrayOpnd =
        baseOpnd->IsArrayRegOpnd() ? baseOpnd->AsArrayRegOpnd()->CopyAsRegOpnd(func) : baseOpnd->Copy(func)->AsRegOpnd();
    arrayOpnd->m_sym = StackSym::New(TyVar, func);
    arrayOpnd->SetValueType(arrayOpnd->GetValueType().ToArray());
    const IR::AutoReuseOpnd autoReuseArrayOpnd(arrayOpnd, func, false /* autoDelete */);
    InsertMove(
        arrayOpnd,
        IR::IndirOpnd::New(
            baseOpnd,
            Js::DynamicObject::GetOffsetOfObjectArray(),
            arrayOpnd->GetType(),
            func),
        insertBeforeInstr);

    return arrayOpnd;
}